

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.h
# Opt level: O2

bool axl::err::completeWithSystemError<bool>(bool result,bool failResult,uint_t errorCode)

{
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> BStack_28;
  
  if ((int)CONCAT71(in_register_00000031,failResult) == (int)CONCAT71(in_register_00000039,result))
  {
    ErrorRef::ErrorRef((ErrorRef *)&BStack_28,errorCode);
    setError((ErrorRef *)&BStack_28);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&BStack_28);
  }
  return result;
}

Assistant:

T
completeWithSystemError(
	T result,
	T failResult,
	uint_t errorCode
) {
	if (result == failResult)
		setError(errorCode);

	return result;
}